

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_send_alert(ptls_t *tls,ptls_buffer_t *sendbuf,uint8_t level,uint8_t description)

{
  ulong body_size_00;
  size_t body_size;
  size_t local_40;
  size_t body_start;
  size_t capacity;
  size_t sStack_28;
  int ret;
  size_t rec_start;
  uint8_t description_local;
  ptls_buffer_t *ppStack_18;
  uint8_t level_local;
  ptls_buffer_t *sendbuf_local;
  ptls_t *tls_local;
  
  sStack_28 = sendbuf->off;
  capacity._4_4_ = 0;
  capacity._1_1_ = 0x15;
  capacity._2_1_ = 3;
  capacity._3_1_ = 3;
  rec_start._6_1_ = description;
  rec_start._7_1_ = level;
  ppStack_18 = sendbuf;
  sendbuf_local = (ptls_buffer_t *)tls;
  capacity._4_4_ = ptls_buffer__do_pushv(sendbuf,(void *)((long)&capacity + 1),3);
  if (capacity._4_4_ == 0) {
    body_start = 2;
    capacity._4_4_ = ptls_buffer__do_pushv(ppStack_18,"",2);
    if (capacity._4_4_ == 0) {
      local_40 = ppStack_18->off;
      body_size._6_1_ = rec_start._7_1_;
      body_size._7_1_ = rec_start._6_1_;
      capacity._4_4_ = ptls_buffer__do_pushv(ppStack_18,(void *)((long)&body_size + 6),2);
      if (capacity._4_4_ == 0) {
        body_size_00 = ppStack_18->off - local_40;
        if (body_start == 0xffffffffffffffff) {
          capacity._4_4_ = ptls_buffer__adjust_quic_blocksize(ppStack_18,body_size_00);
          if (capacity._4_4_ != 0) {
            return capacity._4_4_;
          }
        }
        else {
          if ((body_start < 8) && ((ulong)(1L << ((byte)(body_start << 3) & 0x3f)) <= body_size_00))
          {
            return 0x20c;
          }
          for (; body_start != 0; body_start = body_start - 1) {
            ppStack_18->base[local_40 - body_start] =
                 (uint8_t)(body_size_00 >> (((char)body_start + -1) * '\b' & 0x3fU));
          }
        }
        if ((sendbuf_local[8].capacity != 0) && (7 < (uint)sendbuf_local->capacity)) {
          capacity._4_4_ =
               buffer_encrypt_record
                         (ppStack_18,sStack_28,(st_ptls_traffic_protection_t *)(sendbuf_local + 6));
        }
      }
    }
  }
  return capacity._4_4_;
}

Assistant:

int ptls_send_alert(ptls_t *tls, ptls_buffer_t *sendbuf, uint8_t level, uint8_t description)
{
    size_t rec_start = sendbuf->off;
    int ret = 0;

    buffer_push_record(sendbuf, PTLS_CONTENT_TYPE_ALERT, { ptls_buffer_push(sendbuf, level, description); });
    /* encrypt the alert if we have the encryption keys, unless when it is the early data key */
    if (tls->traffic_protection.enc.aead != NULL && !(tls->state <= PTLS_STATE_CLIENT_EXPECT_FINISHED)) {
        if ((ret = buffer_encrypt_record(sendbuf, rec_start, &tls->traffic_protection.enc)) != 0)
            goto Exit;
    }

Exit:
    return ret;
}